

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000206250 = 0x2e2e2e2e2e2e2e;
    uRam0000000000206257 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00206240 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000206248 = 0x2e2e2e2e2e2e2e;
    DAT_0020624f = 0x2e;
    _DAT_00206230 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000206238 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00206220 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000206228 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000206218 = 0x2e2e2e2e2e2e2e2e;
    DAT_0020625f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}